

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intvar.cc
# Opt level: O0

void __thiscall
tchecker::system::intvars_t::add_intvar
          (intvars_t *this,string *name,intvar_id_t size,integer_t min,integer_t max,
          integer_t initial,attributes_t *attributes)

{
  size_t sVar1;
  size_type sVar2;
  uint local_2c;
  intvar_id_t i;
  integer_t initial_local;
  integer_t max_local;
  integer_t min_local;
  intvar_id_t size_local;
  string *name_local;
  intvars_t *this_local;
  
  integer_variables_t::declare(&this->_integer_variables,name,size,min,max,initial);
  for (local_2c = 0; local_2c < size; local_2c = local_2c + 1) {
    std::vector<tchecker::system::attributes_t,std::allocator<tchecker::system::attributes_t>>::
    emplace_back<tchecker::system::attributes_t_const&>
              ((vector<tchecker::system::attributes_t,std::allocator<tchecker::system::attributes_t>>
                *)&this->_integer_variables_attributes,attributes);
  }
  sVar1 = array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this,VK_FLATTENED);
  sVar2 = std::
          vector<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>::
          size(&this->_integer_variables_attributes);
  if (sVar1 == sVar2) {
    return;
  }
  __assert_fail("_integer_variables.size(tchecker::VK_FLATTENED) == _integer_variables_attributes.size()"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/system/intvar.cc"
                ,0x19,
                "void tchecker::system::intvars_t::add_intvar(const std::string &, tchecker::intvar_id_t, tchecker::integer_t, tchecker::integer_t, tchecker::integer_t, const tchecker::system::attributes_t &)"
               );
}

Assistant:

void intvars_t::add_intvar(std::string const & name, tchecker::intvar_id_t size, tchecker::integer_t min,
                           tchecker::integer_t max, tchecker::integer_t initial,
                           tchecker::system::attributes_t const & attributes)
{
  _integer_variables.declare(name, size, min, max, initial);
  for (tchecker::intvar_id_t i = 0; i < size; ++i)
    _integer_variables_attributes.emplace_back(attributes);
  assert(_integer_variables.size(tchecker::VK_FLATTENED) == _integer_variables_attributes.size());
}